

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O1

void __thiscall SQArray::SQArray(SQArray *this,SQSharedState *ss,SQInteger nsize)

{
  SQObjectPtr local_28;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQArray_00142668;
  (this->_values)._vals = (SQObjectPtr *)0x0;
  (this->_values)._size = 0;
  (this->_values)._allocated = 0;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  sqvector<SQObjectPtr>::resize(&this->_values,nsize,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQArray(SQSharedState *ss,SQInteger nsize){_values.resize(nsize); INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);}